

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outArgs,char *filename)

{
  bool bVar1;
  size_type __n;
  reference __x;
  cmListFileArgument *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range1;
  undefined1 local_68 [8];
  string value;
  string efp;
  char *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outArgs_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs_local;
  cmMakefile *this_local;
  
  GetExecutionFilePath_abi_cxx11_((string *)((long)&value.field_2 + 8),this);
  efp.field_2._8_8_ = filename;
  if (filename == (char *)0x0) {
    efp.field_2._8_8_ = std::__cxx11::string::c_str();
  }
  std::__cxx11::string::string((string *)local_68);
  __n = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::size(inArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(outArgs,__n);
  __end1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(inArgs);
  i = (cmListFileArgument *)
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(inArgs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                     *)&i), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
          ::operator*(&__end1);
    if (__x->Delim == Bracket) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(outArgs,&__x->Value);
    }
    else {
      std::__cxx11::string::operator=((string *)local_68,(string *)__x);
      ExpandVariablesInString
                (this,(string *)local_68,false,false,false,(char *)efp.field_2._8_8_,__x->Line,false
                 ,false);
      if (__x->Delim == Quoted) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(outArgs,(value_type *)local_68);
      }
      else {
        cmSystemTools::ExpandListArgument((string *)local_68,outArgs,false);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&__end1);
  }
  bVar1 = cmSystemTools::GetFatalErrorOccured();
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmMakefile::ExpandArguments(std::vector<cmListFileArgument> const& inArgs,
                                 std::vector<std::string>& outArgs,
                                 const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename) {
    filename = efp.c_str();
  }
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(i.Value);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename, i.Line,
                                  false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(value);
    } else {
      cmSystemTools::ExpandListArgument(value, outArgs);
    }
  }
  return !cmSystemTools::GetFatalErrorOccured();
}